

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-multicast.c
# Opt level: O1

int mc_unpacklocal(lua_State *L)

{
  int iVar1;
  long *plVar2;
  ulong uVar3;
  
  plVar2 = (long *)lua_touserdata(L,1);
  uVar3 = luaL_checkinteger(L,2);
  if ((int)uVar3 == 8) {
    lua_pushlightuserdata(L,(void *)*plVar2);
    lua_pushlightuserdata(L,*(void **)(*plVar2 + 8));
    lua_pushinteger(L,(ulong)*(uint *)(*plVar2 + 4));
    return 3;
  }
  iVar1 = luaL_error(L,"Invalid multicast package size %d",uVar3 & 0xffffffff);
  return iVar1;
}

Assistant:

static int
mc_unpacklocal(lua_State *L) {
	struct mc_package ** pack = lua_touserdata(L,1);
	int sz = luaL_checkinteger(L,2);
	if (sz != sizeof(*pack)) {
		return luaL_error(L, "Invalid multicast package size %d", sz);
	}
	lua_pushlightuserdata(L, *pack);
	lua_pushlightuserdata(L, (*pack)->data);
	lua_pushinteger(L, (lua_Integer)((*pack)->size));
	return 3;
}